

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O2

Tcl_HashEntry * Tcl_NextHashEntry(Tcl_HashSearch *searchPtr)

{
  int iVar1;
  Tcl_HashEntry *pTVar2;
  
  pTVar2 = searchPtr->nextEntryPtr;
  while( true ) {
    if (pTVar2 != (Tcl_HashEntry *)0x0) {
      searchPtr->nextEntryPtr = pTVar2->nextPtr;
      return pTVar2;
    }
    iVar1 = searchPtr->nextIndex;
    if (searchPtr->tablePtr->numBuckets <= iVar1) break;
    pTVar2 = searchPtr->tablePtr->buckets[iVar1];
    searchPtr->nextEntryPtr = pTVar2;
    searchPtr->nextIndex = iVar1 + 1;
  }
  return (Tcl_HashEntry *)0x0;
}

Assistant:

Tcl_HashEntry *
Tcl_NextHashEntry(register Tcl_HashSearch *searchPtr)
{
    Tcl_HashEntry *hPtr;

    while (searchPtr->nextEntryPtr == NULL) {
	if (searchPtr->nextIndex >= searchPtr->tablePtr->numBuckets) {
	    return NULL;
	}
	searchPtr->nextEntryPtr =
	    searchPtr->tablePtr->buckets[searchPtr->nextIndex];
	searchPtr->nextIndex++;
    }
    hPtr = searchPtr->nextEntryPtr;
    searchPtr->nextEntryPtr = hPtr->nextPtr;
    return hPtr;
}